

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_32f1a0::DeleteExpr::printLeft(DeleteExpr *this,OutputStream *S)

{
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  DeleteExpr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  if ((this->IsGlobal & 1U) != 0) {
    StringView::StringView(&local_28,"::");
    OutputStream::operator+=(local_18,local_28);
  }
  StringView::StringView(&local_38,"delete");
  OutputStream::operator+=(local_18,local_38);
  if ((this->IsArray & 1U) != 0) {
    StringView::StringView(&local_48,"[] ");
    OutputStream::operator+=(local_18,local_48);
  }
  Node::print(this->Op,local_18);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsGlobal)
      S += "::";
    S += "delete";
    if (IsArray)
      S += "[] ";
    Op->print(S);
  }